

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool store_reg_kind(DisasContext_conflict1 *s,int rd,TCGv_i32 val,StoreRegKind kind)

{
  TCGContext_conflict1 *tcg_ctx;
  StoreRegKind kind_local;
  TCGv_i32 val_local;
  int rd_local;
  DisasContext_conflict1 *s_local;
  
  switch(kind) {
  case STREG_NONE:
    tcg_temp_free_i32(s->uc->tcg_ctx,val);
    break;
  case STREG_NORMAL:
    if (s->thumb == 0) {
      store_reg_bx(s,rd,val);
    }
    else {
      store_reg(s,rd,val);
    }
    break;
  case STREG_SP_CHECK:
    store_sp_checked(s,val);
    break;
  case STREG_EXC_RET:
    gen_exception_return(s,val);
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.c"
               ,0x1ec8,(char *)0x0);
  }
  return true;
}

Assistant:

static bool store_reg_kind(DisasContext *s, int rd,
                            TCGv_i32 val, StoreRegKind kind)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    switch (kind) {
    case STREG_NONE:
        tcg_temp_free_i32(tcg_ctx, val);
        return true;
    case STREG_NORMAL:
        /* See ALUWritePC: Interworking only from a32 mode. */
        if (s->thumb) {
            store_reg(s, rd, val);
        } else {
            store_reg_bx(s, rd, val);
        }
        return true;
    case STREG_SP_CHECK:
        store_sp_checked(s, val);
        return true;
    case STREG_EXC_RET:
        gen_exception_return(s, val);
        return true;
    }
    g_assert_not_reached();
    // never reach here
    return true;
}